

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall cli::Parser::~Parser(Parser *this)

{
  CmdBase *pCVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)((long)(this->_commands).
                        super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_commands).
                       super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar2 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    pCVar1 = (this->_commands).
             super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar2];
    if (pCVar1 != (CmdBase *)0x0) {
      (*pCVar1->_vptr_CmdBase[1])();
    }
  }
  std::_Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::~_Vector_base
            (&(this->_commands).
              super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_arguments);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Parser() {
			for (int i = 0, n = _commands.size(); i < n; ++i) {
				delete _commands[i];
			}
		}